

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

TimerId __thiscall mario::EventLoop::runEvery(EventLoop *this,double interval,TimerCallback *cb)

{
  Timestamp TVar1;
  TimerId TVar2;
  
  TVar1 = Timestamp::now();
  TVar1 = addTime(TVar1,interval);
  TVar2 = TimerQueue::addTimer
                    ((this->_timerQueue)._M_t.
                     super___uniq_ptr_impl<mario::TimerQueue,_std::default_delete<mario::TimerQueue>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_mario::TimerQueue_*,_std::default_delete<mario::TimerQueue>_>
                     .super__Head_base<0UL,_mario::TimerQueue_*,_false>._M_head_impl,cb,TVar1,
                     interval);
  return TVar2;
}

Assistant:

TimerId EventLoop::runEvery(double interval, const TimerCallback& cb) {
    Timestamp time(addTime(Timestamp::now(), interval));
    return _timerQueue->addTimer(cb, time, interval);
}